

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgMinLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ActivationLinear *pAVar3;
  bool bVar4;
  LogMessage *other;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  Result *_result;
  undefined1 *puVar8;
  string err;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  LogMessage local_68;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar4) {
      validateOutputCount(__return_storage_ptr__,layer,1,1);
      bVar4 = Result::good(__return_storage_ptr__);
      if (bVar4) {
        pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar4) {
          if (layer->_oneof_case_[0] == 0x3fc) {
            puVar8 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar8 = Specification::_ArgMinLayerParams_default_instance_;
          }
          if (((ConcatNDLayerParams *)puVar8)->interleave_ == false) {
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ArgMin","");
            validateInputOutputRankEquality
                      (__return_storage_ptr__,layer,&local_a8,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            bVar4 = Result::good(__return_storage_ptr__);
            if (!bVar4) {
              return __return_storage_ptr__;
            }
            pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar2 != paVar1) {
              operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar4) {
              return __return_storage_ptr__;
            }
          }
          if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
            if (layer->_oneof_case_[0] == 0x3fc) {
              puVar8 = *(undefined1 **)&layer->layer_;
            }
            else {
              puVar8 = Specification::_ArgMinLayerParams_default_instance_;
            }
            if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
              google::protobuf::internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                         ,0x358);
              other = google::protobuf::internal::LogMessage::operator<<
                                (&local_68,"CHECK failed: (index) < (current_size_): ");
              google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,other);
              google::protobuf::internal::LogMessage::~LogMessage(&local_68);
            }
            lVar5 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->
                                         elements[0] + 0x24);
            pAVar3 = (((ActivationParams *)puVar8)->NonlinearityType_).linear_;
            bVar4 = SBORROW8((long)pAVar3,-lVar5) !=
                    (long)&(pAVar3->super_MessageLite)._vptr_MessageLite + lVar5 < 0;
            if (lVar5 <= (long)pAVar3 || bVar4) {
              std::operator+(&local_88,
                             "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
              psVar7 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_c8.field_2._M_allocated_capacity = *psVar7;
                local_c8.field_2._8_8_ = plVar6[3];
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              }
              else {
                local_c8.field_2._M_allocated_capacity = *psVar7;
                local_c8._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_c8._M_string_length = plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if (lVar5 <= (long)pAVar3 || bVar4) {
                return __return_storage_ptr__;
              }
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgMinLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    if (!layer.argmin().removedim()) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "ArgMin", blobNameToRank));
    }
    if (layer.inputtensor_size() > 0) {
        const auto& params = layer.argmin();
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}